

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginDragDropTargetCustom(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  
  pIVar3 = GImGui;
  if ((((GImGui->DragDropActive == true) &&
       (GImGui->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0)) &&
      (pIVar1 = GImGui->CurrentWindow,
      pIVar1->RootWindow == GImGui->HoveredWindowUnderMovingWindow->RootWindow)) &&
     (((bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar4 &&
       ((pIVar3->DragDropPayload).SourceId != id)) && (pIVar1->SkipItems == false)))) {
    IVar2 = bb->Max;
    (pIVar3->DragDropTargetRect).Min = bb->Min;
    (pIVar3->DragDropTargetRect).Max = IVar2;
    IVar2 = (pIVar1->ClipRect).Max;
    (pIVar3->DragDropTargetClipRect).Min = (pIVar1->ClipRect).Min;
    (pIVar3->DragDropTargetClipRect).Max = IVar2;
    pIVar3->DragDropTargetId = id;
    pIVar3->DragDropWithinTarget = true;
    return true;
  }
  return false;
}

Assistant:

bool ImGui::BeginDragDropTargetCustom(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow;
    if (hovered_window == NULL || window->RootWindow != hovered_window->RootWindow)
        return false;
    IM_ASSERT(id != 0);
    if (!IsMouseHoveringRect(bb.Min, bb.Max) || (id == g.DragDropPayload.SourceId))
        return false;
    if (window->SkipItems)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false && g.DragDropWithinSource == false); // Can't nest BeginDragDropSource() and BeginDragDropTarget()
    g.DragDropTargetRect = bb;
    g.DragDropTargetClipRect = window->ClipRect; // May want to be overridden by user depending on use case?
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}